

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O1

void __thiscall OpenMD::RigidBody::updateAtomVel(RigidBody *this)

{
  undefined4 *puVar1;
  pointer pVVar2;
  pointer ppAVar3;
  Atom *pAVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  uint j;
  long lVar12;
  uint j_2;
  double *pdVar13;
  ulong uVar14;
  uint k;
  uint i_3;
  uint i_2;
  uint i;
  long lVar15;
  double (*__return_storage_ptr__) [3];
  undefined4 uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  Vector<double,_3U> result_3;
  SquareMatrix3<double> result;
  Vector<double,_3U> result_2;
  Mat3x3d mat;
  Mat3x3d skewMat;
  Mat3x3d I;
  double local_1f8 [4];
  double local_1d8 [10];
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_168;
  uint uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  double local_158 [10];
  double local_108 [10];
  double local_b8;
  undefined1 auStack_b0 [16];
  double dStack_a0;
  undefined8 local_98;
  undefined1 auStack_90 [16];
  double dStack_80;
  undefined8 local_78;
  double local_68 [8];
  double local_28;
  
  dStack_80 = 0.0;
  local_98 = 0;
  auStack_90 = ZEXT816(0);
  dStack_a0 = 0.0;
  local_b8 = 0.0;
  auStack_b0 = ZEXT816(0);
  lVar15 = 0;
  local_78 = 0;
  lVar12 = *(long *)((long)&(((this->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData).
                            angularMomentum.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (this->super_StuntDouble).storage_);
  lVar9 = (long)(this->super_StuntDouble).localIndex_;
  local_178 = *(undefined8 *)(lVar12 + 0x10 + lVar9 * 0x18);
  local_168 = (undefined4)local_178;
  uStack_170 = 0;
  uStack_164 = (uint)((ulong)local_178 >> 0x20) ^ 0x80000000;
  uStack_160 = 0;
  uStack_15c = 0x80000000;
  puVar1 = (undefined4 *)(lVar12 + lVar9 * 0x18);
  local_188 = *puVar1;
  uStack_184 = puVar1[1];
  uStack_180 = puVar1[2];
  uStack_17c = puVar1[3];
  (*(this->super_StuntDouble)._vptr_StuntDouble[5])(local_68,this);
  local_b8 = 0.0;
  auVar7._8_4_ = uStack_180;
  auVar7._0_8_ = CONCAT44(uStack_184,local_188);
  auVar7._12_4_ = uStack_17c;
  auVar18._8_8_ = auVar7._8_8_ ^ 0x8000000000000000;
  auVar18._0_8_ = local_178;
  dStack_a0 = (double)CONCAT44(uStack_164,local_168) / local_28;
  uVar16 = (undefined4)((ulong)local_68[4] >> 0x20);
  auVar5._8_4_ = SUB84(local_68[4],0);
  auVar5._0_8_ = local_28;
  auVar5._12_4_ = uVar16;
  auStack_b0 = divpd(auVar18,auVar5);
  local_98 = 0;
  dStack_80 = -(double)CONCAT44(uStack_184,local_188) / local_68[0];
  auVar6._8_4_ = SUB84(local_68[4],0);
  auVar6._0_8_ = local_68[0];
  auVar6._12_4_ = uVar16;
  auStack_90 = divpd(auVar7,auVar6);
  local_78 = 0;
  __return_storage_ptr__ = (double (*) [3])local_158;
  StuntDouble::getA((RotMat3x3d *)__return_storage_ptr__,&this->super_StuntDouble);
  local_1d8[8] = 0.0;
  local_1d8[6] = 0.0;
  local_1d8[7] = 0.0;
  local_1d8[4] = 0.0;
  local_1d8[5] = 0.0;
  local_1d8[2] = 0.0;
  local_1d8[3] = 0.0;
  local_1d8[0] = 0.0;
  local_1d8[1] = 0.0;
  do {
    lVar12 = 0;
    pdVar10 = &local_b8;
    do {
      dVar17 = local_1d8[lVar15 * 3 + lVar12];
      lVar9 = 0;
      pdVar8 = pdVar10;
      do {
        dVar17 = dVar17 + (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                          super_RectMatrix<double,_3U,_3U>).data_[0][lVar9] * *pdVar8;
        lVar9 = lVar9 + 1;
        pdVar8 = pdVar8 + 3;
      } while (lVar9 != 3);
      local_1d8[lVar15 * 3 + lVar12] = dVar17;
      lVar12 = lVar12 + 1;
      pdVar10 = pdVar10 + 1;
    } while (lVar12 != 3);
    lVar15 = lVar15 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while (lVar15 != 3);
  pdVar8 = local_108;
  local_108[6] = 0.0;
  local_108[7] = 0.0;
  local_108[4] = 0.0;
  local_108[5] = 0.0;
  local_108[2] = 0.0;
  local_108[3] = 0.0;
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  local_108[8] = 0.0;
  pdVar10 = local_1d8;
  lVar12 = 0;
  do {
    lVar9 = 0;
    pdVar13 = pdVar8;
    do {
      *pdVar13 = pdVar10[lVar9];
      lVar9 = lVar9 + 1;
      pdVar13 = pdVar13 + 3;
    } while (lVar9 != 3);
    lVar12 = lVar12 + 1;
    pdVar8 = pdVar8 + 1;
    pdVar10 = pdVar10 + 3;
  } while (lVar12 != 3);
  lVar9 = (long)(this->super_StuntDouble).localIndex_;
  lVar12 = *(long *)((long)&(((this->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData).
                            velocity.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (this->super_StuntDouble).storage_);
  local_1d8[2] = (double)*(undefined8 *)(lVar12 + 0x10 + lVar9 * 0x18);
  pdVar10 = (double *)(lVar12 + lVar9 * 0x18);
  local_1d8[0] = *pdVar10;
  local_1d8[1] = pdVar10[1];
  pVVar2 = (this->refCoords_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)(this->refCoords_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2;
  if (lVar12 != 0) {
    uVar11 = (lVar12 >> 3) * -0x5555555555555555;
    ppAVar3 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar14 = 0;
    do {
      pAVar4 = ppAVar3[uVar14];
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar12 = 0;
      pdVar10 = local_108;
      do {
        dVar17 = local_158[lVar12];
        lVar9 = 0;
        do {
          dVar17 = dVar17 + pdVar10[lVar9] * pVVar2[uVar14].super_Vector<double,_3U>.data_[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        local_158[lVar12] = dVar17;
        lVar12 = lVar12 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar12 != 3);
      local_1f8[0] = 0.0;
      local_1f8[1] = 0.0;
      local_1f8[2] = 0.0;
      lVar12 = 0;
      do {
        local_1f8[lVar12] = local_1d8[lVar12] + local_158[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar9 = (long)(pAVar4->super_StuntDouble).localIndex_;
      lVar12 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                atomData).velocity.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                        (pAVar4->super_StuntDouble).storage_);
      *(double *)(lVar12 + 0x10 + lVar9 * 0x18) = local_1f8[2];
      pdVar10 = (double *)(lVar12 + lVar9 * 0x18);
      *pdVar10 = local_1f8[0];
      pdVar10[1] = local_1f8[1];
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (uVar14 <= uVar11 && uVar11 - uVar14 != 0);
  }
  return;
}

Assistant:

void RigidBody::updateAtomVel() {
    Mat3x3d skewMat;

    Vector3d ji = getJ();
    Mat3x3d I   = getI();

    skewMat(0, 0) = 0;
    skewMat(0, 1) = ji[2] / I(2, 2);
    skewMat(0, 2) = -ji[1] / I(1, 1);

    skewMat(1, 0) = -ji[2] / I(2, 2);
    skewMat(1, 1) = 0;
    skewMat(1, 2) = ji[0] / I(0, 0);

    skewMat(2, 0) = ji[1] / I(1, 1);
    skewMat(2, 1) = -ji[0] / I(0, 0);
    skewMat(2, 2) = 0;

    Mat3x3d mat    = (getA() * skewMat).transpose();
    Vector3d rbVel = getVel();

    Vector3d velRot;
    for (unsigned int i = 0; i < refCoords_.size(); ++i) {
      atoms_[i]->setVel(rbVel + mat * refCoords_[i]);
    }
  }